

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void __thiscall kratos::Generator::transfer_content(Generator *this,Generator *gen,string *prefix)

{
  _Rb_tree_node_base *p_Var1;
  __shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  Var *pVVar4;
  _Base_ptr p_Var5;
  uint64_t i;
  ulong uVar6;
  __shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  __node_base *p_Var8;
  string local_b0;
  __shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> local_90;
  undefined1 local_80 [8];
  string target_name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  *parameters;
  
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  reserve(&gen->stmts_,
          ((long)(this->stmts_).
                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->stmts_).
                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) +
          ((long)(gen->stmts_).
                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(gen->stmts_).
                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4));
  p_Var2 = &((this->stmts_).
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var7 = &((this->stmts_).
                  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>; p_Var7 != p_Var2;
      p_Var7 = p_Var7 + 1) {
    std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_90,p_Var7);
    add_stmt(gen,(shared_ptr<kratos::Stmt> *)&local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  }
  p_Var8 = &(this->exprs_)._M_h._M_before_begin;
  while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
    Var::set_parent_generator((Var *)p_Var8[1]._M_nxt,gen);
    std::
    _Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<std::shared_ptr<kratos::Expr>const&>
              ((_Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&gen->exprs_,p_Var8 + 1);
  }
  target_name.field_2._8_8_ = &(this->vars_)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var5 = (this->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var5 != (_Base_ptr)target_name.field_2._8_8_;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    p_Var1 = p_Var5 + 1;
    *(Generator **)(*(long *)(p_Var5 + 2) + 0x200) = gen;
    std::__cxx11::string::string((string *)local_80,(string *)p_Var1);
    bVar3 = has_var(gen,(string *)p_Var1);
    if (bVar3) {
      get_unique_variable_name(&local_b0,this,prefix,(string *)p_Var1);
      std::__cxx11::string::operator=((string *)local_80,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    p_Var1 = p_Var5 + 2;
    std::__cxx11::string::_M_assign((string *)(*(long *)p_Var1 + 0x78));
    if ((*(Var **)p_Var1)->type_ == PortIO) {
      pVVar4 = var(gen,*(Var **)p_Var1,(string *)local_80);
      (**(code **)(**(long **)p_Var1 + 0xa0))(*(long **)p_Var1,pVVar4);
      Var::move_sink_to(*(Var **)p_Var1,pVVar4,gen,false);
      Var::move_src_to(*(Var **)p_Var1,pVVar4,gen,false);
    }
    else {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
      ::_M_emplace_unique<std::__cxx11::string&,std::shared_ptr<kratos::Var>const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                  *)&gen->vars_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 (shared_ptr<kratos::Var> *)p_Var1);
    }
    pVVar4 = *(Var **)p_Var1;
    if (this->parent_generator_ == gen) {
      set_var_params(pVVar4,&gen->params_);
    }
    else {
      (*(pVVar4->super_IRNode)._vptr_IRNode[0x23])(pVVar4,0);
      for (uVar6 = 0; pVVar4 = *(Var **)p_Var1,
          uVar6 < (ulong)((long)(pVVar4->size_).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(pVVar4->size_).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 2); uVar6 = uVar6 + 1) {
        Var::set_size_param(pVVar4,(uint32_t)uVar6,(Var *)0x0);
      }
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::clear
            (&this->stmts_);
  std::
  _Hashtable<std::shared_ptr<kratos::Expr>,_std::shared_ptr<kratos::Expr>,_std::allocator<std::shared_ptr<kratos::Expr>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Expr>_>,_std::hash<std::shared_ptr<kratos::Expr>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->exprs_)._M_h);
  return;
}

Assistant:

void Generator::transfer_content(kratos::Generator &gen, const std::string &prefix) {
    // move all stuff to the generator
    // except the variable
    gen.stmts_.reserve(gen.stmts_.size() + stmts_.size());
    for (auto const &stmt : stmts_) {
        gen.add_stmt(stmt);
    }
    for (auto const &expr : exprs_) {
        expr->set_parent_generator(&gen);
        gen.exprs_.emplace(expr);
    }

    for (auto const &[var_name, var] : vars_) {
        var->set_generator(&gen);
        std::string target_name = var_name;
        if (gen.has_var(var_name)) {
            target_name = get_unique_variable_name(prefix, var_name);
        }
        var->name = target_name;
        // maybe it's a port, in that case we need to copy its definition and create a var
        if (var->type() == VarType::PortIO) {
            auto &new_var = gen.var(*var, target_name);
            var->move_linked_to(&new_var);
            Var::move_sink_to(var.get(), &new_var, &gen, false);
            Var::move_src_to(var.get(), &new_var, &gen, false);
        } else {
            gen.vars_.emplace(target_name, var);
        }
        if (parent_generator_ == &gen) {
            const auto &parameters = gen.params_;
            set_var_params(var.get(), parameters);
        } else {
            // unlink parameters
            var->set_width_param(nullptr);
            for (uint64_t i = 0; i < var->size().size(); i++) {
                var->set_size_param(i, nullptr);
            }
        }
    }

    stmts_.clear();
    exprs_.clear();
}